

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O2

RSA * d2i_RSA_PUBKEY(RSA **a,uchar **pp,long length)

{
  rsa_st *prVar1;
  pointer __p;
  UniquePtr<RSA> rsa;
  UniquePtr<EVP_PKEY> pkey;
  CBS cbs;
  _Head_base<0UL,_rsa_st_*,_false> local_38;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_30;
  CBS local_28;
  
  if (length < 0) {
    prVar1 = (rsa_st *)0x0;
  }
  else {
    local_28.data = *pp;
    local_28.len = length;
    local_30._M_head_impl = EVP_parse_public_key(&local_28);
    if ((EVP_PKEY *)local_30._M_head_impl == (EVP_PKEY *)0x0) {
      prVar1 = (rsa_st *)0x0;
    }
    else {
      prVar1 = (rsa_st *)EVP_PKEY_get1_RSA((EVP_PKEY *)local_30._M_head_impl);
      local_38._M_head_impl = prVar1;
      if (prVar1 != (rsa_st *)0x0) {
        if (a != (RSA **)0x0) {
          RSA_free(*a);
          *a = (RSA *)prVar1;
        }
        *pp = local_28.data;
        local_38._M_head_impl = (rsa_st *)0x0;
      }
      std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&local_38);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_30);
  }
  return (RSA *)prVar1;
}

Assistant:

RSA *d2i_RSA_PUBKEY(RSA **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return nullptr;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  bssl::UniquePtr<EVP_PKEY> pkey(EVP_parse_public_key(&cbs));
  if (pkey == nullptr) {
    return nullptr;
  }
  bssl::UniquePtr<RSA> rsa(EVP_PKEY_get1_RSA(pkey.get()));
  if (rsa == nullptr) {
    return nullptr;
  }
  if (out != nullptr) {
    RSA_free(*out);
    *out = rsa.get();
  }
  *inp = CBS_data(&cbs);
  return rsa.release();
}